

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall
lume::Mesh::insert<std::__detail::_Node_iterator<lume::Grob,true,false>>
          (Mesh *this,_Node_iterator<lume::Grob,_true,_false> begin,
          _Node_iterator<lume::Grob,_true,_false> end)

{
  bool bVar1;
  reference grob;
  _Node_iterator_base<lume::Grob,_false> local_28;
  _Node_iterator<lume::Grob,_true,_false> i;
  Mesh *this_local;
  _Node_iterator<lume::Grob,_true,_false> end_local;
  _Node_iterator<lume::Grob,_true,_false> begin_local;
  
  local_28 = begin.super__Node_iterator_base<lume::Grob,_false>._M_cur;
  i.super__Node_iterator_base<lume::Grob,_false>._M_cur =
       (_Node_iterator_base<lume::Grob,_false>)(_Node_iterator_base<lume::Grob,_false>)this;
  this_local = (Mesh *)end.super__Node_iterator_base<lume::Grob,_false>._M_cur;
  end_local.super__Node_iterator_base<lume::Grob,_false>._M_cur =
       begin.super__Node_iterator_base<lume::Grob,_false>._M_cur;
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&local_28,(_Node_iterator_base<lume::Grob,_false> *)&this_local);
    if (!bVar1) break;
    grob = std::__detail::_Node_iterator<lume::Grob,_true,_false>::operator*
                     ((_Node_iterator<lume::Grob,_true,_false> *)&local_28);
    insert(this,grob);
    std::__detail::_Node_iterator<lume::Grob,_true,_false>::operator++
              ((_Node_iterator<lume::Grob,_true,_false> *)&local_28);
  }
  return;
}

Assistant:

void insert (const iter_t begin, const iter_t end)
	{
		for (iter_t i = begin; i != end; ++i)
			insert (*i);
	}